

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::
CompactRMatrixLimitedUncertainties
          (CompactRMatrixLimitedUncertainties *this,ParticlePairs *pairs,
          vector<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
          *groups)

{
  double dVar1;
  pointer pdVar2;
  pointer pSVar3;
  
  *(undefined8 *)
   &(this->particle_pairs_).super_ListRecord.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
    super__Tuple_impl<2UL,_long,_long,_long,_long> =
       *(undefined8 *)
        &(pairs->super_ListRecord).metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->particle_pairs_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 8))->_M_head_impl =
       ((_Head_base<4UL,_long,_false> *)
       ((long)&(pairs->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 8))->_M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->particle_pairs_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       ((_Head_base<3UL,_long,_false> *)
       ((long)&(pairs->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  dVar1 = (pairs->super_ListRecord).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Head_base<1UL,_double,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->particle_pairs_).super_ListRecord.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       (pairs->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  (this->particle_pairs_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = dVar1;
  (this->particle_pairs_).super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       (pairs->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  pdVar2 = (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->particle_pairs_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->particle_pairs_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = pdVar2;
  (this->particle_pairs_).super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pairs->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar3 = (groups->
           super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (groups->
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar3;
  (this->spin_groups_).
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (groups->
       super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (groups->
  super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  verifySize((int)((ulong)((long)(this->spin_groups_).
                                 super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->spin_groups_).
                                super__Vector_base<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup,_std::allocator<njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::SpinGroup>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * 0x38e38e39);
  return;
}

Assistant:

CompactRMatrixLimitedUncertainties( ParticlePairs&& pairs,
                                    std::vector< SpinGroup >&& groups ) :
    // no need for a try ... catch: nothing can go wrong here
    particle_pairs_( std::move( pairs ) ),
    spin_groups_( std::move( groups ) ) {

      verifySize( this->NJSX() );
    }